

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O1

void __thiscall Valve::findOpenHeadLoss(Valve *this,double q)

{
  double dVar1;
  
  dVar1 = ABS(q) * (this->lossFactor + this->lossFactor);
  (this->super_Link).hGrad = dVar1;
  if (1e-06 <= dVar1) {
    dVar1 = dVar1 * q * 0.5;
  }
  else {
    (this->super_Link).hGrad = 1e-06;
    dVar1 = q * 1e-06;
  }
  (this->super_Link).hLoss = dVar1;
  return;
}

Assistant:

void Valve::findOpenHeadLoss(double q)
{
    hGrad = 2.0 * lossFactor * abs(q);
    if ( hGrad < MIN_GRADIENT )
    {
        hGrad = MIN_GRADIENT;
        hLoss = hGrad * q;
    }
    else hLoss = hGrad * q / 2.0;
}